

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  Filetree tree;
  int argc_local;
  char **argv_local;
  GSList *files;
  GSList *errors;
  
  errors = (GSList *)0x0;
  files = (GSList *)0x0;
  argc_local = argc;
  argv_local = argv;
  iVar1 = parse_global_args(&argc_local,&argv_local,entries,1);
  if (((iVar1 == 0) && (1 < argc_local)) && (help == 0)) {
    __s1 = argv_local[1];
    iVar1 = strcmp(__s1,"scan");
    if (iVar1 == 0) {
      iVar2 = loudness_scan_parse(&argc_local,&argv_local);
    }
    else {
      iVar2 = strcmp(__s1,"dump");
      if (iVar2 != 0) {
        iVar1 = strcmp(__s1,"--version");
        if (iVar1 == 0) {
          print_version();
          exit(0);
        }
        fprintf(_stderr,"Unknown mode \'%s\'\n",__s1);
        goto LAB_0010282a;
      }
      iVar2 = loudness_dump_parse(&argc_local,&argv_local);
    }
    if (iVar2 != 0) {
      if ((decode_to_file == (gchar *)0x0) || (argc_local == 2)) {
        input_init(*argv_local,forced_plugin);
        scanner_init_common();
        setlocale(3,"");
        iVar2 = 0;
        setlocale(0,"");
        tree = filetree_init(argv_local + 1,(long)argc_local - 1,recursive,follow_symlinks,no_sort,
                             &errors);
        g_slist_foreach(errors,filetree_print_error,&verbose);
        g_slist_foreach(errors,filetree_free_error,0);
        g_slist_free(errors);
        filetree_file_list(tree,&files);
        filetree_remove_common_prefix(files);
        if (iVar1 == 0) {
          loudness_scan(files);
        }
        else {
          iVar2 = loudness_dump(files);
        }
        g_slist_foreach(files,filetree_free_list_entry,0);
        g_slist_free(files);
        filetree_destroy(tree);
        input_deinit();
        g_free(forced_plugin);
        return iVar2;
      }
      fwrite("Cannot decode more than one file\n",0x21,1,_stderr);
    }
  }
  else {
    print_help();
  }
LAB_0010282a:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
	GSList *errors = NULL;
	GSList *files = NULL;
	Filetree tree;
	int mode = 0;
	int mode_parsed = FALSE;
	int ret = 0;

	if (parse_global_args(&argc, &argv, entries, TRUE) || argc < 2 ||
	    help) {
		print_help();
		exit(EXIT_FAILURE);
	}
	if (!strcmp(argv[1], "scan")) {
		mode = LOUDNESS_MODE_SCAN;
		mode_parsed = loudness_scan_parse(&argc, &argv);
#ifdef USE_TAGLIB
	} else if (!strcmp(argv[1], "tag")) {
		mode = LOUDNESS_MODE_TAG;
		mode_parsed = loudness_tag_parse(&argc, &argv);
#endif
	} else if (!strcmp(argv[1], "dump")) {
		mode = LOUDNESS_MODE_DUMP;
		mode_parsed = loudness_dump_parse(&argc, &argv);
	} else if (!strcmp(argv[1], "--version")) {
		print_version();
		exit(EXIT_SUCCESS);
	} else {
		fprintf(stderr, "Unknown mode '%s'\n", argv[1]);
	}
	if (!mode_parsed) {
		exit(EXIT_FAILURE);
	}
	if (decode_to_file && argc - 1 != 1) {
		fprintf(stderr, "Cannot decode more than one file\n");
		exit(EXIT_FAILURE);
	}

	input_init(argv[0], forced_plugin);
	scanner_init_common();

	setlocale(LC_COLLATE, "");
	setlocale(LC_CTYPE, "");
	tree = filetree_init(&argv[1], (size_t)(argc - 1), recursive,
	    follow_symlinks, no_sort, &errors);

	g_slist_foreach(errors, filetree_print_error, &verbose);
	g_slist_foreach(errors, filetree_free_error, NULL);
	g_slist_free(errors);

	filetree_file_list(tree, &files);
	filetree_remove_common_prefix(files);

	switch (mode) {
	case LOUDNESS_MODE_SCAN:
		loudness_scan(files);
		break;
#ifdef USE_TAGLIB
	case LOUDNESS_MODE_TAG:
		ret = loudness_tag(files);
		break;
#endif
	case LOUDNESS_MODE_DUMP:
		ret = loudness_dump(files);
		break;
	}

	g_slist_foreach(files, filetree_free_list_entry, NULL);
	g_slist_free(files);

	filetree_destroy(tree);
	input_deinit();
	g_free(forced_plugin);

	return ret;
}